

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O3

interval_t duckdb::ToHoursOperator::Operation<long,duckdb::interval_t>(long input)

{
  undefined1 auVar1 [16];
  bool bVar2;
  OutOfRangeException *this;
  interval_t result;
  ulong local_68;
  string local_60;
  string local_40;
  
  bVar2 = duckdb::TryMultiplyOperator::Operation<long,long,long>(input,3600000000,(long *)&local_68)
  ;
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_68;
    return (interval_t)(auVar1 << 0x40);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Interval value %s hours out of range","");
  NumericHelper::ToString<long>(&local_40,input);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this,&local_60,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		interval_t result;
		result.months = 0;
		result.days = 0;
		if (!TryMultiplyOperator::Operation<TA, int64_t, int64_t>(input, Interval::MICROS_PER_HOUR, result.micros)) {
			throw OutOfRangeException("Interval value %s hours out of range", NumericHelper::ToString(input));
		}
		return result;
	}